

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall
capnp::JsonCodec::decodeObject
          (JsonCodec *this,Reader input,StructSchema type,Orphanage orphanage,Builder output)

{
  bool bVar1;
  Field fieldSchema;
  Reader fieldValue;
  undefined8 uVar2;
  StringPtr name;
  DebugExpression<bool> _kjCondition_1;
  Fault f_1;
  IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
  local_1b0;
  StructSchema type_local;
  Fault f;
  anon_union_64_1_a8c68091_for_NullableValue<capnp::StructSchema::Field>_2 local_148;
  Reader local_108;
  DebugExpression<bool> _kjCondition;
  Reader field;
  Reader local_60;
  
  type_local = type;
  if (input._reader.dataSize < 0x10) {
    _kjCondition.value = false;
  }
  else {
    _kjCondition.value = *input._reader.data == 5;
    if (_kjCondition.value) {
      capnp::json::Value::Reader::getObject(&local_60,&input);
      local_1b0.index = 0;
      local_1b0.container = &local_60;
      do {
        if (local_1b0.index == local_60.reader.elementCount) {
          return;
        }
        capnp::_::
        IndexingIterator<const_capnp::List<capnp::json::Value::Field,_(capnp::Kind)3>::Reader,_capnp::json::Value::Field::Reader>
        ::operator*(&field,&local_1b0);
        name.content = (ArrayPtr<const_char>)capnp::json::Value::Field::Reader::getName(&field);
        StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&f,&type_local,name);
        if ((char)f.exception == '\x01') {
          uVar2 = local_148.value.parent.super_Schema.raw;
          capnp::json::Value::Field::Reader::getValue(&local_108,&field);
          fieldSchema._8_8_ = local_148._8_8_;
          fieldSchema.parent.super_Schema.raw = (Schema)(Schema)uVar2;
          fieldSchema.proto._reader.segment = local_148.value.proto._reader.segment;
          fieldSchema.proto._reader.capTable = local_148.value.proto._reader.capTable;
          fieldSchema.proto._reader.data = local_148.value.proto._reader.data;
          fieldSchema.proto._reader.pointers = local_148.value.proto._reader.pointers;
          fieldSchema.proto._reader._32_8_ = local_148._48_8_;
          fieldSchema.proto._reader._40_8_ = local_148._56_8_;
          fieldValue._reader.capTable = local_108._reader.capTable;
          fieldValue._reader.segment = local_108._reader.segment;
          fieldValue._reader.data = local_108._reader.data;
          fieldValue._reader.pointers = local_108._reader.pointers;
          fieldValue._reader.dataSize = local_108._reader.dataSize;
          fieldValue._reader.pointerCount = local_108._reader.pointerCount;
          fieldValue._reader._38_2_ = local_108._reader._38_2_;
          fieldValue._reader.nestingLimit = local_108._reader.nestingLimit;
          fieldValue._reader._44_4_ = local_108._reader._44_4_;
          decodeField(this,fieldSchema,fieldValue,orphanage,output);
        }
        else {
          bVar1 = ((this->impl).ptr)->rejectUnknownFields;
          _kjCondition_1.value = (bool)(bVar1 ^ 1);
          if (bVar1 != false) {
            _f = (ArrayPtr<const_char>)capnp::json::Value::Field::Reader::getName(&field);
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[14],capnp::Text::Reader>
                      (&f_1,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                       ,399,FAILED,"!impl->rejectUnknownFields",
                       "_kjCondition,\"Unknown field\", field.getName()",&_kjCondition_1,
                       (char (*) [14])"Unknown field",(Reader *)&f);
            kj::_::Debug::Fault::fatal(&f_1);
          }
        }
        local_1b0.index = local_1b0.index + 1;
      } while( true );
    }
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[22]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
             ,0x18a,FAILED,"input.isObject()","_kjCondition,\"Expected object value\"",&_kjCondition
             ,(char (*) [22])"Expected object value");
  kj::_::Debug::Fault::~Fault(&f);
  return;
}

Assistant:

void JsonCodec::decodeObject(JsonValue::Reader input, StructSchema type, Orphanage orphanage, DynamicStruct::Builder output) const {
  KJ_REQUIRE(input.isObject(), "Expected object value") { return; }
  for (auto field: input.getObject()) {
    KJ_IF_SOME(fieldSchema, type.findFieldByName(field.getName())) {
      decodeField(fieldSchema, field.getValue(), orphanage, output);
    } else {
      KJ_REQUIRE(!impl->rejectUnknownFields, "Unknown field", field.getName());
    }
  }